

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gltf.cpp
# Opt level: O3

void vera::extractMesh(Model *_model,Mesh *_mesh,mat4 _matrix,Scene *_scene,bool _verbose)

{
  _Rb_tree_node_base *p_Var1;
  Accessor *this;
  BufferView *bufferViewObject;
  int iVar2;
  pointer pAVar3;
  pointer pBVar4;
  pointer pBVar5;
  long lVar6;
  bool bVar7;
  uint32_t byteStride;
  int iVar8;
  ostream *poVar9;
  long *plVar10;
  _Rb_tree_node_base *p_Var11;
  Material *_mat;
  Model *this_00;
  mapped_type *ppMVar12;
  undefined8 uVar13;
  uint uVar14;
  undefined7 in_register_00000009;
  bool _verbose_00;
  ulong uVar15;
  ulong uVar16;
  void *pvVar17;
  pointer pPVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  vec4 tan;
  vec3 local_1b8;
  uint local_1ac;
  float local_1a8;
  float local_1a4;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_1a0;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_19c;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_198;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_194;
  Scene *local_190;
  ModelsMap *local_188;
  Mesh *local_180;
  ulong local_178;
  pointer local_170;
  _Rb_tree_node_base *local_168;
  Mesh mesh;
  anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3 local_78;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_74;
  
  uVar14 = (uint)CONCAT71(in_register_00000009,_verbose);
  uVar15 = CONCAT71(in_register_00000009,_verbose) & 0xffffffff;
  local_190 = _scene;
  if (uVar14 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Parsing Mesh ",0xf);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(_mesh->name)._M_dataplus._M_p,
                        (_mesh->name)._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  pPVar18 = (_mesh->primitives).
            super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((_mesh->primitives).
      super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>._M_impl.
      super__Vector_impl_data._M_finish != pPVar18) {
    fVar24 = _matrix.value[1].field_1.y * _matrix.value[2].field_2.z -
             _matrix.value[1].field_2.z * _matrix.value[2].field_1.y;
    fVar25 = _matrix.value[0].field_1.y * _matrix.value[2].field_2.z -
             _matrix.value[0].field_2.z * _matrix.value[2].field_1.y;
    fVar26 = _matrix.value[0].field_1.y * _matrix.value[1].field_2.z -
             _matrix.value[0].field_2.z * _matrix.value[1].field_1.y;
    fVar23 = 1.0 / (_matrix.value[2].field_0.x * fVar26 +
                   (_matrix.value[0].field_0.x * fVar24 - fVar25 * _matrix.value[1].field_0.x));
    local_1a8 = (_matrix.value[1].field_0.x * _matrix.value[2].field_1.y -
                _matrix.value[1].field_1.y * _matrix.value[2].field_0.x) * fVar23;
    local_1a4 = (_matrix.value[0].field_0.x * _matrix.value[1].field_1.y -
                _matrix.value[0].field_1.y * _matrix.value[1].field_0.x) * fVar23;
    local_188 = &local_190->models;
    uVar16 = 0;
    local_1ac = uVar14;
    local_180 = _mesh;
    do {
      if ((char)uVar15 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"   primitive ",0xd);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pPVar18 = (_mesh->primitives).
                  super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      Mesh::Mesh(&mesh);
      if (-1 < (long)pPVar18[uVar16].indices) {
        extractIndices(_model,(_model->accessors).
                              super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>
                              ._M_impl.super__Vector_impl_data._M_start + pPVar18[uVar16].indices,
                       &mesh);
      }
      local_170 = pPVar18 + uVar16;
      mesh.m_drawMode = TRIANGLES;
      if ((ulong)(uint)local_170->mode < 7) {
        mesh.m_drawMode = *(DrawMode *)(&DAT_0030bdd8 + (ulong)(uint)local_170->mode * 4);
      }
      p_Var11 = (local_170->attributes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_168 = &(local_170->attributes)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_178 = uVar16;
      if (p_Var11 != local_168) {
        do {
          pAVar3 = (_model->accessors).
                   super__Vector_base<tinygltf::Accessor,_std::allocator<tinygltf::Accessor>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pBVar4 = (_model->bufferViews).
                   super__Vector_base<tinygltf::BufferView,_std::allocator<tinygltf::BufferView>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          this = pAVar3 + (int)p_Var11[2]._M_color;
          iVar2 = pAVar3[(int)p_Var11[2]._M_color].bufferView;
          bufferViewObject = pBVar4 + iVar2;
          iVar2 = pBVar4[iVar2].buffer;
          pBVar5 = (_model->buffers).
                   super__Vector_base<tinygltf::Buffer,_std::allocator<tinygltf::Buffer>_>._M_impl.
                   super__Vector_impl_data._M_start;
          byteStride = tinygltf::Accessor::ByteStride(this,bufferViewObject);
          p_Var1 = p_Var11 + 1;
          iVar8 = std::__cxx11::string::compare((char *)p_Var1);
          if (iVar8 == 0) {
            if (this->count != 0) {
              local_194 = _matrix.value[0].field_2;
              local_198 = _matrix.value[1].field_2;
              local_19c = _matrix.value[2].field_2;
              local_1a0 = _matrix.value[3].field_2;
              pvVar17 = (void *)0x0;
              do {
                tan.field_0.x = 1.0;
                tan.field_1.y = 1.0;
                tan.field_2.z = 1.0;
                tan.field_3.w = 1.0;
                uVar15 = this->byteOffset + bufferViewObject->byteOffset;
                lVar6 = *(long *)&pBVar5[iVar2].data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data;
                if ((ulong)((long)*(pointer *)
                                   ((long)&pBVar5[iVar2].data.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl + 8) - lVar6) <= uVar15) {
                  std::__throw_out_of_range_fmt
                            (
                            "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                            );
                  goto LAB_00285ce2;
                }
                extractVertexData((uint32_t)pvVar17,(uint8_t *)(lVar6 + uVar15),this->componentType,
                                  this->type,false,byteStride,(float *)&tan,'\x03');
                local_1b8.field_2.z =
                     tan.field_3.w * local_1a0.z + tan.field_2.z * local_19c.z +
                     tan.field_1.y * local_198.z + tan.field_0.x * local_194.z;
                local_78 = _matrix.value[3].field_0;
                aStack_74 = _matrix.value[3].field_1;
                local_1b8.field_1.y =
                     tan.field_3.w * aStack_74.y + tan.field_2.z * _matrix.value[2].field_1.y +
                     tan.field_1.y * _matrix.value[1].field_1.y +
                     tan.field_0.x * _matrix.value[0].field_1.y;
                local_1b8.field_0.x =
                     tan.field_3.w * local_78.x + tan.field_2.z * _matrix.value[2].field_0.x +
                     tan.field_1.y * _matrix.value[1].field_0.x +
                     tan.field_0.x * _matrix.value[0].field_0.x;
                Mesh::addVertex(&mesh,&local_1b8);
                pvVar17 = (void *)((long)pvVar17 + 1);
              } while (pvVar17 < (void *)this->count);
            }
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)p_Var1);
            if (iVar8 == 0) {
              if (this->count != 0) {
                pvVar17 = (void *)0x0;
                do {
                  tan.field_0.x = 1.0;
                  tan.field_1.y = 1.0;
                  tan.field_2.z = 1.0;
                  tan.field_3.w = 1.0;
                  uVar15 = this->byteOffset + bufferViewObject->byteOffset;
                  lVar6 = *(long *)&pBVar5[iVar2].data.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data;
                  if ((ulong)((long)*(pointer *)
                                     ((long)&pBVar5[iVar2].data.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl + 8) - lVar6) <= uVar15) goto LAB_00285ce2;
                  extractVertexData((uint32_t)pvVar17,(uint8_t *)(lVar6 + uVar15),
                                    this->componentType,this->type,false,byteStride,(float *)&tan,
                                    '\x04');
                  Mesh::addColor(&mesh,&tan);
                  pvVar17 = (void *)((long)pvVar17 + 1);
                } while (pvVar17 < (void *)this->count);
              }
            }
            else {
              iVar8 = std::__cxx11::string::compare((char *)p_Var1);
              if (iVar8 == 0) {
                if (this->count != 0) {
                  pvVar17 = (void *)0x0;
                  do {
                    uVar15 = this->byteOffset + bufferViewObject->byteOffset;
                    lVar6 = *(long *)&pBVar5[iVar2].data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data;
                    if ((ulong)((long)*(pointer *)
                                       ((long)&pBVar5[iVar2].data.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl + 8) - lVar6) <= uVar15) goto LAB_00285cf0;
                    extractVertexData((uint32_t)pvVar17,(uint8_t *)(lVar6 + uVar15),
                                      this->componentType,this->type,false,byteStride,(float *)&tan,
                                      '\x03');
                    fVar21 = local_1a4 * tan.field_2.z +
                             local_1a8 * tan.field_0.x +
                             -(_matrix.value[2].field_1.y * _matrix.value[0].field_0.x -
                              _matrix.value[2].field_0.x * _matrix.value[0].field_1.y) * fVar23 *
                             tan.field_1.y;
                    fVar19 = tan.field_2.z * fVar26 * fVar23 +
                             tan.field_0.x * fVar24 * fVar23 + tan.field_1.y * -fVar25 * fVar23;
                    fVar20 = tan.field_2.z *
                             -(_matrix.value[1].field_2.z * _matrix.value[0].field_0.x -
                              _matrix.value[0].field_2.z * _matrix.value[1].field_0.x) * fVar23 +
                             tan.field_0.x *
                             -(_matrix.value[1].field_0.x * _matrix.value[2].field_2.z -
                              _matrix.value[1].field_2.z * _matrix.value[2].field_0.x) * fVar23 +
                             tan.field_1.y *
                             (_matrix.value[2].field_2.z * _matrix.value[0].field_0.x -
                             _matrix.value[0].field_2.z * _matrix.value[2].field_0.x) * fVar23;
                    fVar22 = 1.0 / SQRT(fVar20 * fVar20 + fVar19 * fVar19 + fVar21 * fVar21);
                    local_1b8.field_2.z = fVar21 * fVar22;
                    local_1b8.field_1.y = fVar22 * fVar20;
                    local_1b8.field_0.x = fVar22 * fVar19;
                    Mesh::addNormal(&mesh,&local_1b8);
                    pvVar17 = (void *)((long)pvVar17 + 1);
                  } while (pvVar17 < (void *)this->count);
                }
              }
              else {
                iVar8 = std::__cxx11::string::compare((char *)p_Var1);
                if (iVar8 == 0) {
                  if (this->count != 0) {
                    pvVar17 = (void *)0x0;
                    do {
                      uVar15 = this->byteOffset + bufferViewObject->byteOffset;
                      lVar6 = *(long *)&pBVar5[iVar2].data.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data;
                      if ((ulong)((long)*(pointer *)
                                         ((long)&pBVar5[iVar2].data.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl + 8) - lVar6) <= uVar15)
                      goto LAB_00285cfe;
                      extractVertexData((uint32_t)pvVar17,(uint8_t *)(lVar6 + uVar15),
                                        this->componentType,this->type,false,byteStride,
                                        (float *)&tan,'\x02');
                      Mesh::addTexCoord(&mesh,(vec2 *)&tan);
                      pvVar17 = (void *)((long)pvVar17 + 1);
                    } while (pvVar17 < (void *)this->count);
                  }
                }
                else {
                  iVar8 = std::__cxx11::string::compare((char *)p_Var1);
                  if (iVar8 == 0) {
                    if (this->count != 0) {
                      pvVar17 = (void *)0x0;
                      do {
                        uVar15 = this->byteOffset + bufferViewObject->byteOffset;
                        lVar6 = *(long *)&pBVar5[iVar2].data.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data;
                        if ((ulong)((long)*(pointer *)
                                           ((long)&pBVar5[iVar2].data.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl + 8) - lVar6) <= uVar15)
                        goto LAB_00285d0c;
                        extractVertexData((uint32_t)pvVar17,(uint8_t *)(lVar6 + uVar15),
                                          this->componentType,this->type,false,byteStride,
                                          (float *)&tan,'\x04');
                        Mesh::addTangent(&mesh,&tan);
                        pvVar17 = (void *)((long)pvVar17 + 1);
                      } while (pvVar17 < (void *)this->count);
                    }
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                    std::ostream::put(-0x28);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Attribute: ",0xb);
                    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                                       ((ostream *)&std::cout,*(char **)(p_Var11 + 1),
                                        (long)p_Var11[1]._M_parent);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  type        :",0xf);
                    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,this->type);
                    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                    std::ostream::put((char)plVar10);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  component   :",0xf);
                    plVar10 = (long *)std::ostream::operator<<
                                                ((ostream *)&std::cout,this->componentType);
                    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                    std::ostream::put((char)plVar10);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  normalize   :",0xf);
                    poVar9 = std::ostream::_M_insert<bool>(true);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  bufferView  :",0xf);
                    plVar10 = (long *)std::ostream::operator<<
                                                ((ostream *)&std::cout,this->bufferView);
                    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                    std::ostream::put((char)plVar10);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  byteOffset  :",0xf);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  count       :",0xf);
                    poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
                    std::ostream::put((char)poVar9);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"  byteStride  :",0xf);
                    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,byteStride);
                    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
                    std::ostream::put((char)plVar10);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
                    std::ostream::put(-0x28);
                    std::ostream::flush();
                  }
                }
              }
            }
          }
          p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
        } while (p_Var11 != local_168);
      }
      pPVar18 = local_170;
      uVar16 = local_178;
      _mesh = local_180;
      uVar15 = (ulong)local_1ac;
      _verbose_00 = SUB41(local_1ac,0);
      if (_verbose_00 != false) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    vertices = ",0xf);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    colors   = ",0xf);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    normals  = ",0xf);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    uvs      = ",0xf);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    indices  = ",0xf);
        poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if (mesh.m_drawMode == LINES) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"    lines    = ",0xf);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        }
        else {
          if (mesh.m_drawMode != TRIANGLES) goto LAB_00285b70;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"    triang.  = ",0xf);
          poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        }
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
LAB_00285b70:
      if ((mesh.m_normals.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           mesh.m_normals.
           super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) &&
         (bVar7 = Mesh::computeNormals(&mesh), (bVar7 & _verbose_00) == 1)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    . Compute normals",0x15);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      bVar7 = Mesh::computeTangents(&mesh);
      if ((bVar7 & _verbose_00) == 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"    . Compute tangents",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
      }
      _mat = extractMaterial(_model,(_model->materials).
                                    super__Vector_base<tinygltf::Material,_std::allocator<tinygltf::Material>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pPVar18->material,
                             local_190,_verbose_00);
      this_00 = (Model *)operator_new(0x2d8);
      Model::Model(this_00,&_mesh->name,&mesh,_mat);
      ppMVar12 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vera::Model_*>_>_>
                 ::operator[](local_188,&_mesh->name);
      *ppMVar12 = this_00;
      Mesh::~Mesh(&mesh);
      uVar16 = uVar16 + 1;
      pPVar18 = (_mesh->primitives).
                super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar16 < (ulong)(((long)(_mesh->primitives).
                                     super__Vector_base<tinygltf::Primitive,_std::allocator<tinygltf::Primitive>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar18 >> 5
                              ) * -0x71c71c71c71c71c7));
  }
  return;
LAB_00285ce2:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00285cf0:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00285cfe:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00285d0c:
  uVar13 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  operator_delete(pvVar17);
  Mesh::~Mesh(&mesh);
  _Unwind_Resume(uVar13);
}

Assistant:

void extractMesh(const tinygltf::Model& _model, const tinygltf::Mesh& _mesh, glm::mat4 _matrix, Scene* _scene, bool _verbose) {
    if (_verbose)
        std::cout << "  Parsing Mesh " << _mesh.name << std::endl;

    glm::mat3 normalMatrix = glm::transpose(glm::inverse(glm::mat3(_matrix)));

    for (size_t i = 0; i < _mesh.primitives.size(); ++i) {
        if (_verbose)
            std::cout << "   primitive " << i + 1 << "/" << _mesh.primitives.size() << std::endl;

        const tinygltf::Primitive &primitive = _mesh.primitives[i];

        Mesh mesh;
        if (primitive.indices >= 0)
            extractIndices(_model, _model.accessors[primitive.indices], mesh);
        mesh.setDrawMode(extractMode(primitive));

        // Extract Vertex Data
        for (auto &attrib : primitive.attributes) {
            const tinygltf::Accessor &accessor = _model.accessors[attrib.second];
            const tinygltf::BufferView &bufferView = _model.bufferViews[accessor.bufferView];
            const tinygltf::Buffer &buffer = _model.buffers[bufferView.buffer];
            int byteStride = accessor.ByteStride(bufferView);

            if (attrib.first.compare("POSITION") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 pos = glm::vec4(1.0);
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &pos[0], 3);
                    mesh.addVertex( glm::vec3(_matrix * pos) );
                }
            }

            else if (attrib.first.compare("COLOR_0") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 col = glm::vec4(1.0f);
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &col[0], 4);
                    mesh.addColor(col);
                }
            }

            else if (attrib.first.compare("NORMAL") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec3 nor;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &nor[0], 3);
                    mesh.addNormal( normalize(normalMatrix * nor) );
                }
            }

            else if (attrib.first.compare("TEXCOORD_0") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec2 uv;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &uv[0], 2);
                    mesh.addTexCoord(uv);
                }
            }

            else if (attrib.first.compare("TANGENT") == 0)  {
                for (size_t v = 0; v < accessor.count; v++) {
                    glm::vec4 tan;
                    extractVertexData(v, &buffer.data.at(bufferView.byteOffset + accessor.byteOffset), accessor.componentType, accessor.type, accessor.normalized, byteStride, &tan[0], 4);
                    mesh.addTangent(tan);
                }
            }

            else {
                std::cout << " " << std::endl;
                std::cout << "Attribute: " << attrib.first << std::endl;
                std::cout << "  type        :" << accessor.type << std::endl;
                std::cout << "  component   :" << accessor.componentType << std::endl;
                std::cout << "  normalize   :" << accessor.normalized << std::endl;
                std::cout << "  bufferView  :" << accessor.bufferView << std::endl;
                std::cout << "  byteOffset  :" << accessor.byteOffset << std::endl;
                std::cout << "  count       :" << accessor.count << std::endl;
                std::cout << "  byteStride  :" << byteStride << std::endl;
                std::cout << " "<< std::endl;
            }
        }

        if (_verbose) {
            std::cout << "    vertices = " << mesh.getVertices().size() << std::endl;
            std::cout << "    colors   = " << mesh.getColors().size() << std::endl;
            std::cout << "    normals  = " << mesh.getNormals().size() << std::endl;
            std::cout << "    uvs      = " << mesh.getTexCoords().size() << std::endl;
            std::cout << "    indices  = " << mesh.getIndices().size() << std::endl;

            if (mesh.getDrawMode() == GL_TRIANGLES) {
                std::cout << "    triang.  = " << mesh.getIndices().size()/3 << std::endl;
            }
            else if (mesh.getDrawMode() == GL_LINES ) {
                std::cout << "    lines    = " << mesh.getIndices().size()/2 << std::endl;
            }
        }

        if ( !mesh.haveNormals() )
            if ( mesh.computeNormals() )
                if ( _verbose )
                    std::cout << "    . Compute normals" << std::endl;

        if ( mesh.computeTangents() )
            if ( _verbose )
                std::cout << "    . Compute tangents" << std::endl;

        Material* mat = extractMaterial( _model, _model.materials[primitive.material], _scene, _verbose );
        _scene->models[_mesh.name] = new Model(_mesh.name, mesh, mat);
    }
}